

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsptree.c
# Opt level: O1

void bsp_get_point(void *handle,int idx,float *point)

{
  byte bVar1;
  long lVar2;
  bsp_tree *tree;
  ulong uVar3;
  
  bVar1 = *(byte *)((long)handle + 8);
  if ((ulong)bVar1 != 0) {
    lVar2 = *handle;
    uVar3 = 0;
    do {
      point[uVar3] = *(float *)(*(long *)(lVar2 + uVar3 * 8) + (long)idx * 4);
      uVar3 = uVar3 + 1;
    } while (bVar1 != uVar3);
  }
  return;
}

Assistant:

void
bsp_get_point(
    void * handle,
    int idx,
    float * point )
{
    bsp_tree * tree;
    int i;

    tree = (bsp_tree *) handle;
    assert( tree != NULL && point != NULL );

    assert( idx >= 0 && idx < array_count(tree->pointarrays[0]) );

    for ( i = 0; i < tree->dimensions; i++ )
        point[i] = tree->pointarrays[i][idx];
}